

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool send_shutdown,_Bool *done)

{
  long lVar1;
  SSL *ssl;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  uint uVar4;
  uint ret_code;
  int iVar5;
  ulong error;
  uint *puVar6;
  undefined7 in_register_00000011;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  _Bool input_pending;
  char buf [1024];
  _Bool local_445;
  undefined4 local_444;
  void *local_440;
  char local_438 [1032];
  
  local_440 = cf->ctx;
  lVar1 = *(long *)((long)local_440 + 0x30);
  ssl = *(SSL **)(lVar1 + 8);
  if ((ssl == (SSL *)0x0) || ((cf->field_0x24 & 2) != 0)) goto LAB_0016d33a;
  *(undefined4 *)((long)local_440 + 0x58) = 0;
  *done = false;
  uVar4 = SSL_get_shutdown(ssl);
  ret_code = 0xffffffff;
  if ((uVar4 & 1) == 0) {
    local_444 = (undefined4)CONCAT71(in_register_00000011,send_shutdown);
    ERR_clear_error();
    lVar8 = 9;
    do {
      ret_code = SSL_read(*(SSL **)(lVar1 + 8),local_438,0x400);
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016ceb8;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016ceb8:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"SSL shutdown not sent, read -> %d",(ulong)ret_code);
          }
        }
      }
      bVar9 = lVar8 != 0;
      lVar8 = lVar8 + -1;
    } while ((0 < (int)ret_code) && (bVar9));
    iVar5 = SSL_get_error(*(SSL **)(lVar1 + 8),ret_code);
    send_shutdown = SUB41(local_444,0);
    if ((ret_code != 0) || (iVar5 != 6)) goto LAB_0016cf2e;
    if (send_shutdown != false) {
      _Var3 = (*cf->next->cft->is_alive)(cf->next,data,&local_445);
      if (_Var3) {
        ret_code = 0;
        goto LAB_0016cf2e;
      }
      *(byte *)((long)local_440 + 0x5c) = *(byte *)((long)local_440 + 0x5c) | 2;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016d318;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d318:
          if (0 < cf->cft->log_level) {
            pcVar7 = "peer closed connection";
            goto LAB_0016d328;
          }
        }
      }
      goto LAB_0016d33a;
    }
    if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8cd & 0x10) == 0)) goto LAB_0016d33a;
    pcVar2 = (data->state).feat;
    if (pcVar2 != (curl_trc_feat *)0x0) {
      if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) goto LAB_0016d265;
      goto LAB_0016d33a;
    }
    if (cf == (Curl_cfilter *)0x0) goto LAB_0016d33a;
LAB_0016d265:
    if (cf->cft->log_level < 1) goto LAB_0016d33a;
    pcVar7 = "SSL shutdown received, not sending";
LAB_0016d328:
    Curl_trc_cf_infof(data,cf,pcVar7);
    goto LAB_0016d33a;
  }
LAB_0016cf2e:
  if (send_shutdown == false) {
LAB_0016cfd9:
    lVar8 = 9;
    do {
      ERR_clear_error();
      uVar4 = SSL_read(*(SSL **)(lVar1 + 8),local_438,0x400);
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016d029;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d029:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"SSL shutdown read -> %d",(ulong)uVar4);
          }
        }
      }
      bVar9 = lVar8 != 0;
      lVar8 = lVar8 + -1;
    } while ((0 < (int)uVar4) && (bVar9));
    iVar5 = SSL_get_error(*(SSL **)(lVar1 + 8),uVar4);
    switch(iVar5) {
    case 0:
    case 2:
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016d20c;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d20c:
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"SSL shutdown sent, want receive");
          }
        }
      }
      *(undefined4 *)((long)local_440 + 0x58) = 1;
      goto LAB_0016d33d;
    default:
      error = ERR_get_error();
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016d2f1;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d2f1:
          if (0 < cf->cft->log_level) {
            if (error == 0) {
              pcVar7 = SSL_ERROR_to_str(iVar5);
            }
            else {
              pcVar7 = ossl_strerror(error,local_438,0x400);
            }
            puVar6 = (uint *)__errno_location();
            Curl_trc_cf_infof(data,cf,"SSL shutdown, ignore recv error: \'%s\', errno %d",pcVar7,
                              (ulong)*puVar6);
          }
        }
      }
      break;
    case 3:
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016d2a5;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d2a5:
          if (0 < cf->cft->log_level) {
            pcVar7 = "SSL shutdown send blocked";
LAB_0016d2cc:
            Curl_trc_cf_infof(data,cf,pcVar7);
          }
        }
      }
      goto LAB_0016d2d9;
    case 6:
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016d287;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d287:
          if (0 < cf->cft->log_level) {
            pcVar7 = "SSL shutdown not received, but closed";
            goto LAB_0016d328;
          }
        }
      }
    }
LAB_0016d33a:
    *done = true;
  }
  else {
    ERR_clear_error();
    iVar5 = SSL_shutdown(*(SSL **)(lVar1 + 8));
    if (iVar5 == 1) {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
        pcVar2 = (data->state).feat;
        if (pcVar2 == (curl_trc_feat *)0x0) {
          if (cf != (Curl_cfilter *)0x0) goto LAB_0016d243;
        }
        else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d243:
          if (0 < cf->cft->log_level) {
            pcVar7 = "SSL shutdown finished";
            goto LAB_0016d328;
          }
        }
      }
      goto LAB_0016d33a;
    }
    iVar5 = SSL_get_error(*(SSL **)(lVar1 + 8),ret_code);
    if (iVar5 != 3) goto LAB_0016cfd9;
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_0016d2bc;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar2->log_level)) {
LAB_0016d2bc:
        if (0 < cf->cft->log_level) {
          pcVar7 = "SSL shutdown still wants to send";
          goto LAB_0016d2cc;
        }
      }
    }
LAB_0016d2d9:
    *(undefined4 *)((long)local_440 + 0x58) = 2;
  }
LAB_0016d33d:
  cf->field_0x24 = cf->field_0x24 & 0xfd | *done * '\x02';
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_shutdown(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool send_shutdown, bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;
  CURLcode result = CURLE_OK;
  char buf[1024];
  int nread = -1, err;
  unsigned long sslerr;
  size_t i;

  DEBUGASSERT(octx);
  if(!octx->ssl || cf->shutdown) {
    *done = TRUE;
    goto out;
  }

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  *done = FALSE;
  if(!(SSL_get_shutdown(octx->ssl) & SSL_SENT_SHUTDOWN)) {
    /* We have not started the shutdown from our side yet. Check
     * if the server already sent us one. */
    ERR_clear_error();
    for(i = 0; i < 10; ++i) {
      nread = SSL_read(octx->ssl, buf, (int)sizeof(buf));
      CURL_TRC_CF(data, cf, "SSL shutdown not sent, read -> %d", nread);
      if(nread <= 0)
        break;
    }
    err = SSL_get_error(octx->ssl, nread);
    if(!nread && err == SSL_ERROR_ZERO_RETURN) {
      bool input_pending;
      /* Yes, it did. */
      if(!send_shutdown) {
        CURL_TRC_CF(data, cf, "SSL shutdown received, not sending");
        *done = TRUE;
        goto out;
      }
      else if(!cf->next->cft->is_alive(cf->next, data, &input_pending)) {
        /* Server closed the connection after its closy notify. It
         * seems not interested to see our close notify, so do not
         * send it. We are done. */
        connssl->peer_closed = TRUE;
        CURL_TRC_CF(data, cf, "peer closed connection");
        *done = TRUE;
        goto out;
      }
    }
  }

  /* SSL should now have started the shutdown from our side. Since it
   * was not complete, we are lacking the close notify from the server. */
  if(send_shutdown) {
    ERR_clear_error();
    if(SSL_shutdown(octx->ssl) == 1) {
      CURL_TRC_CF(data, cf, "SSL shutdown finished");
      *done = TRUE;
      goto out;
    }
    if(SSL_ERROR_WANT_WRITE == SSL_get_error(octx->ssl, nread)) {
      CURL_TRC_CF(data, cf, "SSL shutdown still wants to send");
      connssl->io_need = CURL_SSL_IO_NEED_SEND;
      goto out;
    }
    /* Having sent the close notify, we use SSL_read() to get the
     * missing close notify from the server. */
  }

  for(i = 0; i < 10; ++i) {
    ERR_clear_error();
    nread = SSL_read(octx->ssl, buf, (int)sizeof(buf));
    CURL_TRC_CF(data, cf, "SSL shutdown read -> %d", nread);
    if(nread <= 0)
      break;
  }
  err = SSL_get_error(octx->ssl, nread);
  switch(err) {
  case SSL_ERROR_ZERO_RETURN: /* no more data */
    CURL_TRC_CF(data, cf, "SSL shutdown not received, but closed");
    *done = TRUE;
    break;
  case SSL_ERROR_NONE: /* just did not get anything */
  case SSL_ERROR_WANT_READ:
    /* SSL has send its notify and now wants to read the reply
     * from the server. We are not really interested in that. */
    CURL_TRC_CF(data, cf, "SSL shutdown sent, want receive");
    connssl->io_need = CURL_SSL_IO_NEED_RECV;
    break;
  case SSL_ERROR_WANT_WRITE:
    CURL_TRC_CF(data, cf, "SSL shutdown send blocked");
    connssl->io_need = CURL_SSL_IO_NEED_SEND;
    break;
  default:
    /* Server seems to have closed the connection without sending us
     * a close notify. */
    sslerr = ERR_get_error();
    CURL_TRC_CF(data, cf, "SSL shutdown, ignore recv error: '%s', errno %d",
                (sslerr ?
                 ossl_strerror(sslerr, buf, sizeof(buf)) :
                 SSL_ERROR_to_str(err)),
                SOCKERRNO);
    *done = TRUE;
    result = CURLE_OK;
    break;
  }

out:
  cf->shutdown = (result || *done);
  return result;
}